

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_Hatch::SetGradientRepeat(ON_Hatch *this,double repeat)

{
  ON_GradientColorData *pOVar1;
  bool bVar2;
  
  pOVar1 = ON_GradientColorData::FromObject((ON_Object *)this);
  bVar2 = true;
  if (((repeat != 0.0) || (NAN(repeat))) || (pOVar1 != (ON_GradientColorData *)0x0)) {
    pOVar1 = ON_GradientColorData::FromObject((ON_Object *)this,true);
    if (pOVar1 == (ON_GradientColorData *)0x0) {
      bVar2 = false;
    }
    else {
      pOVar1->m_repeat = repeat;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Hatch::SetGradientRepeat(double repeat)
{
  ON_GradientColorData* data = ON_GradientColorData::FromObject(this);
  if (nullptr == data && 0 == repeat)
    return true;

  data = ON_GradientColorData::FromObject(this, true);
  if (nullptr == data)
    return false;
  
  data->m_repeat = repeat;
  return true;
}